

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O1

int qc_poll_start(QcPoll *poll_,int timeout)

{
  int iVar1;
  
  iVar1 = poll((pollfd *)poll_->fdarray,poll_->num,timeout);
  if (iVar1 < 0) {
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0x169,"poll failed");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int qc_poll_start(QcPoll *poll_, int timeout)
{
    int n;

    n = poll(poll_->fdarray, poll_->num, timeout);
    if(n<0)
    {
        qc_error("poll failed");
        return -1;
    }

    return n;
}